

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

void testing::internal::
     GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<yamc::checked::timed_mutex,yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>>
               (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *param_1,
               int param_2)

{
  int local_3c;
  string local_38;
  
  local_3c = param_2;
  StreamableToString<int>(&local_38,&local_3c);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>(param_1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  GenerateNamesRecursively<testing::internal::DefaultNameGenerator,testing::internal::Types<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>>>
            (param_1,param_2 + 1);
  return;
}

Assistant:

void GenerateNamesRecursively(Types, std::vector<std::string>* result, int i) {
  result->push_back(NameGenerator::template GetName<typename Types::Head>(i));
  GenerateNamesRecursively<NameGenerator>(typename Types::Tail(), result,
                                          i + 1);
}